

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::ReservoirSamplePercentage::Deserialize
          (ReservoirSamplePercentage *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  ReservoirSamplePercentage *this_00;
  pointer pRVar3;
  undefined4 extraout_var;
  double extraout_XMM0_Qa;
  unique_ptr<duckdb::ReservoirSamplePercentage,_std::default_delete<duckdb::ReservoirSamplePercentage>,_true>
  result;
  _Head_base<0UL,_duckdb::ReservoirSamplePercentage_*,_false> local_30;
  double local_28;
  idx_t iVar4;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"sample_percentage");
  (*deserializer->_vptr_Deserializer[0x19])(deserializer);
  local_28 = extraout_XMM0_Qa;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (ReservoirSamplePercentage *)operator_new(0x60);
  ReservoirSamplePercentage(this_00,local_28,-1);
  local_30._M_head_impl = this_00;
  pRVar3 = unique_ptr<duckdb::ReservoirSamplePercentage,_std::default_delete<duckdb::ReservoirSamplePercentage>,_true>
           ::operator->((unique_ptr<duckdb::ReservoirSamplePercentage,_std::default_delete<duckdb::ReservoirSamplePercentage>,_true>
                         *)&local_30);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"reservoir_sample_size");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  pRVar3->reservoir_sample_size = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSamplePercentage::Deserialize(Deserializer &deserializer) {
	auto sample_percentage = deserializer.ReadProperty<double>(200, "sample_percentage");
	auto result = duckdb::unique_ptr<ReservoirSamplePercentage>(new ReservoirSamplePercentage(sample_percentage));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "reservoir_sample_size", result->reservoir_sample_size);
	return std::move(result);
}